

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt1CopyPalCommand::Execute
          (DrawColumnRt1CopyPalCommand *this,DrawerThread *thread)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int pitch;
  int count;
  uint8_t *dest;
  uint8_t *source;
  DrawerThread *thread_local;
  DrawColumnRt1CopyPalCommand *this_local;
  
  uVar2 = DrawerThread::count_for_thread
                    (thread,(this->super_PalRtCommand).yl,
                     ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)uVar2) {
    iVar4 = (this->super_PalRtCommand).yl;
    iVar3 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _pitch = (this->super_PalRtCommand)._destorg +
             (*(int *)(ylookup + (long)(iVar4 + iVar3) * 4) + (this->super_PalRtCommand).sx);
    puVar1 = thread->dc_temp;
    iVar4 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = puVar1 + (iVar4 * 4 + *(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc);
    iVar4 = (this->super_PalRtCommand)._pitch * thread->num_cores;
    if ((uVar2 & 1) != 0) {
      *_pitch = *dest;
      dest = dest + 4;
      _pitch = _pitch + iVar4;
    }
    if ((uVar2 & 2) != 0) {
      *_pitch = *dest;
      _pitch[iVar4] = dest[4];
      dest = dest + 8;
      _pitch = _pitch + iVar4 * 2;
    }
    for (iVar3 = (int)uVar2 >> 2; iVar3 != 0; iVar3 = iVar3 + -1) {
      *_pitch = *dest;
      _pitch[iVar4] = dest[4];
      _pitch[iVar4 * 2] = dest[8];
      _pitch[iVar4 * 3] = dest[0xc];
      dest = dest + 0x10;
      _pitch = _pitch + iVar4 * 4;
    }
  }
  return;
}

Assistant:

void DrawColumnRt1CopyPalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;

		if (count & 1) {
			*dest = *source;
			source += 4;
			dest += pitch;
		}
		if (count & 2) {
			dest[0] = source[0];
			dest[pitch] = source[4];
			source += 8;
			dest += pitch*2;
		}
		if (!(count >>= 2))
			return;

		do {
			dest[0] = source[0];
			dest[pitch] = source[4];
			dest[pitch*2] = source[8];
			dest[pitch*3] = source[12];
			source += 16;
			dest += pitch*4;
		} while (--count);
	}